

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Bitmap.cxx
# Opt level: O1

void __thiscall
Fl_Xlib_Graphics_Driver::draw
          (Fl_Xlib_Graphics_Driver *this,Fl_Bitmap *bm,int XP,int YP,int WP,int HP,int cx,int cy)

{
  int iVar1;
  int iVar2;
  int Y;
  int X;
  int H;
  int W;
  
  iVar1 = Fl_Bitmap::start(bm,XP,YP,WP,HP,&cx,&cy,&X,&Y,&W,&H);
  if (iVar1 == 0) {
    XSetStipple(fl_display,fl_gc,bm->id_);
    iVar1 = X - cx;
    if (iVar1 < 0) {
      iVar1 = iVar1 + (bm->super_Fl_Image).w_;
    }
    iVar2 = Y - cy;
    if (iVar2 < 0) {
      iVar2 = iVar2 + (bm->super_Fl_Image).h_;
    }
    XSetTSOrigin(fl_display,fl_gc,iVar1,iVar2);
    XSetFillStyle(fl_display,fl_gc,2);
    XFillRectangle(fl_display,fl_window,fl_gc,X,Y,W,H);
    XSetFillStyle(fl_display,fl_gc,0);
  }
  return;
}

Assistant:

void Fl_Xlib_Graphics_Driver::draw(Fl_Bitmap *bm, int XP, int YP, int WP, int HP, int cx, int cy) {
  int X, Y, W, H;
  if (bm->start(XP, YP, WP, HP, cx, cy, X, Y, W, H)) {
    return;
  }
  
  XSetStipple(fl_display, fl_gc, bm->id_);
  int ox = X-cx; if (ox < 0) ox += bm->w();
  int oy = Y-cy; if (oy < 0) oy += bm->h();
  XSetTSOrigin(fl_display, fl_gc, ox, oy);
  XSetFillStyle(fl_display, fl_gc, FillStippled);
  XFillRectangle(fl_display, fl_window, fl_gc, X, Y, W, H);
  XSetFillStyle(fl_display, fl_gc, FillSolid);
}